

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PolicyPoolPartialJPolValPair.cpp
# Opt level: O2

string * __thiscall
PolicyPoolPartialJPolValPair::SoftPrint_abi_cxx11_
          (string *__return_storage_ptr__,PolicyPoolPartialJPolValPair *this)

{
  pointer psVar1;
  priority_queue<boost::shared_ptr<PartialJPDPValuePair>,_std::vector<boost::shared_ptr<PartialJPDPValuePair>,_std::allocator<boost::shared_ptr<PartialJPDPValuePair>_>_>,_std::less<boost::shared_ptr<PartialJPDPValuePair>_>_>
  *this_00;
  ostream *poVar2;
  PartialJPDPValuePair_sharedPtr jpvp;
  string local_1d0 [32];
  stringstream ss;
  ostream local_1a0 [376];
  
  std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  this_00 = (priority_queue<boost::shared_ptr<PartialJPDPValuePair>,_std::vector<boost::shared_ptr<PartialJPDPValuePair>,_std::allocator<boost::shared_ptr<PartialJPDPValuePair>_>_>,_std::less<boost::shared_ptr<PartialJPDPValuePair>_>_>
             *)operator_new(0x20);
  std::
  vector<boost::shared_ptr<PartialJPDPValuePair>,_std::allocator<boost::shared_ptr<PartialJPDPValuePair>_>_>
  ::vector((vector<boost::shared_ptr<PartialJPDPValuePair>,_std::allocator<boost::shared_ptr<PartialJPDPValuePair>_>_>
            *)this_00,&this->_m_jpvpQueue_p->c);
  while (psVar1 = (this_00->c).
                  super__Vector_base<boost::shared_ptr<PartialJPDPValuePair>,_std::allocator<boost::shared_ptr<PartialJPDPValuePair>_>_>
                  ._M_impl.super__Vector_impl_data._M_start,
        (this_00->c).
        super__Vector_base<boost::shared_ptr<PartialJPDPValuePair>,_std::allocator<boost::shared_ptr<PartialJPDPValuePair>_>_>
        ._M_impl.super__Vector_impl_data._M_finish != psVar1) {
    jpvp.px = psVar1->px;
    jpvp.pn.pi_ = (psVar1->pn).pi_;
    if (jpvp.pn.pi_ != (sp_counted_base *)0x0) {
      LOCK();
      (jpvp.pn.pi_)->use_count_ = (jpvp.pn.pi_)->use_count_ + 1;
      UNLOCK();
    }
    (*((jpvp.px)->super_PartialJointPolicyValuePair).super_PartialPolicyPoolItemInterface.
      _vptr_PartialPolicyPoolItemInterface[0xf])(local_1d0);
    poVar2 = std::operator<<(local_1a0,local_1d0);
    std::endl<char,std::char_traits<char>>(poVar2);
    std::__cxx11::string::~string(local_1d0);
    std::
    priority_queue<boost::shared_ptr<PartialJPDPValuePair>,_std::vector<boost::shared_ptr<PartialJPDPValuePair>,_std::allocator<boost::shared_ptr<PartialJPDPValuePair>_>_>,_std::less<boost::shared_ptr<PartialJPDPValuePair>_>_>
    ::pop(this_00);
    boost::detail::shared_count::~shared_count(&jpvp.pn);
  }
  std::
  vector<boost::shared_ptr<PartialJPDPValuePair>,_std::allocator<boost::shared_ptr<PartialJPDPValuePair>_>_>
  ::~vector((vector<boost::shared_ptr<PartialJPDPValuePair>,_std::allocator<boost::shared_ptr<PartialJPDPValuePair>_>_>
             *)this_00);
  operator_delete(this_00,0x20);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  return __return_storage_ptr__;
}

Assistant:

string PolicyPoolPartialJPolValPair::SoftPrint() const
{
    stringstream ss;
    priority_queue<PartialJPDPValuePair_sharedPtr> *new_jpvpQueue_p = 
        new priority_queue<PartialJPDPValuePair_sharedPtr>(*_m_jpvpQueue_p);

    while(new_jpvpQueue_p->size() > 0)
    {
        PartialJPDPValuePair_sharedPtr jpvp = new_jpvpQueue_p->top();
        ss << jpvp->SoftPrint() << endl;

        new_jpvpQueue_p->pop();    
    }

    delete new_jpvpQueue_p;
    return(ss.str());
}